

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O2

date_t duckdb::FromDateCast<long>(long year,long month,long day)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ConversionException *this;
  allocator local_4d;
  date_t result;
  string local_48;
  
  iVar2 = Cast::Operation<long,int>(year);
  iVar3 = Cast::Operation<long,int>(month);
  iVar4 = Cast::Operation<long,int>(day);
  cVar1 = duckdb::Date::TryFromDate(iVar2,iVar3,iVar4,&result);
  if (cVar1 != '\0') {
    return (date_t)result.days;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_48,"Date out of range: %d-%d-%d",&local_4d);
  ConversionException::ConversionException<long,long,long>(this,&local_48,year,month,day);
  __cxa_throw(this,&ConversionException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static date_t FromDateCast(T year, T month, T day) {
	date_t result;
	if (!Date::TryFromDate(Cast::Operation<T, int32_t>(year), Cast::Operation<T, int32_t>(month),
	                       Cast::Operation<T, int32_t>(day), result)) {
		throw ConversionException("Date out of range: %d-%d-%d", year, month, day);
	}
	return result;
}